

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

Token * __thiscall jsonnet::internal::anon_unknown_0::Parser::pop(Parser *this)

{
  Token *in_RDI;
  Token *unaff_retaddr;
  Token *tok;
  Token *pTVar1;
  
  pTVar1 = in_RDI;
  peek((Parser *)0x2915ef);
  Token::Token(unaff_retaddr,pTVar1);
  std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::pop_front
            ((list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)in_RDI);
  return in_RDI;
}

Assistant:

Token pop(void)
    {
        Token tok = peek();
        tokens.pop_front();
        return tok;
    }